

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridsample_bilinear_compute_blob.h
# Opt level: O2

void ncnn::gridsample_2d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)1,true>
               (Mat *src,Mat *grid,Mat *offset_value,int permute_fusion)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  void *pvVar6;
  size_t sVar7;
  size_t sVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  uint uVar15;
  uint in_R10D;
  byte bVar16;
  uint uVar17;
  ulong uVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  int iVar22;
  float fVar23;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  int iVar24;
  float extraout_XMM0_Db_01;
  float extraout_XMM0_Db_02;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  void *local_98;
  uint *local_78;
  
  uVar17 = grid->h * grid->w;
  local_78 = (uint *)offset_value->data;
  if (permute_fusion == 0) {
    local_98 = grid->data;
    sVar7 = grid->cstep;
    sVar8 = grid->elemsize;
    uVar14 = 0xffffffff;
    for (lVar11 = 0; lVar11 < grid->c; lVar11 = lVar11 + 1) {
      for (lVar13 = 0; (int)lVar13 < (int)uVar17; lVar13 = lVar13 + 2) {
        uVar3 = *(undefined8 *)((long)local_98 + lVar13 * 4);
        uVar5 = src->w;
        uVar10 = src->h;
        fVar19 = (float)(uVar5 + -1) * ((float)uVar3 * 0.5 + 0.5);
        fVar23 = (float)(uVar10 + -1) * ((float)((ulong)uVar3 >> 0x20) * 0.5 + 0.5);
        fVar20 = floorf(fVar19);
        fVar21 = floorf(fVar23);
        iVar22 = (int)fVar20;
        iVar24 = (int)fVar21;
        iVar1 = iVar22 + 1;
        iVar2 = iVar24 + 1;
        auVar28._0_4_ = -(uint)(-1 < iVar22);
        auVar28._4_4_ = -(uint)(-1 < iVar24);
        auVar28._8_4_ = -(uint)(-1 < (int)extraout_XMM0_Db_01);
        auVar28._12_4_ = -(uint)(-1 < (int)extraout_XMM0_Db_02);
        auVar32._0_4_ = -(uint)(iVar22 < (int)uVar5);
        auVar32._4_4_ = -(uint)(iVar24 < (int)uVar10);
        auVar32._8_4_ = -(uint)((int)extraout_XMM0_Db_01 < 0);
        auVar32._12_4_ = -(uint)((int)extraout_XMM0_Db_02 < 0);
        auVar32 = auVar32 & auVar28;
        auVar29._0_8_ = auVar32._0_8_;
        auVar29._8_4_ = auVar32._4_4_;
        auVar29._12_4_ = auVar32._12_4_;
        auVar30._0_8_ = auVar29._0_8_ << 0x3f;
        auVar30._8_8_ = auVar29._8_8_ << 0x3f;
        in_R10D = movmskpd(in_R10D,auVar30);
        bVar16 = (byte)in_R10D >> 1;
        in_R10D = in_R10D & 1;
        *local_78 = -(uint)((bVar16 & in_R10D) == 0) | (uVar5 * iVar24 + iVar22) * src->elempack;
        uVar15 = uVar14;
        if (((iVar1 < (int)uVar5 && -2 < iVar22) & bVar16) != 0) {
          uVar15 = (iVar24 * src->w + iVar1) * src->elempack;
        }
        local_78[1] = uVar15;
        uVar15 = uVar14;
        if (((-2 < iVar24 && iVar2 < (int)uVar10) & in_R10D) != 0) {
          uVar15 = (src->w * iVar2 + iVar22) * src->elempack;
        }
        local_78[2] = uVar15;
        uVar15 = uVar14;
        if ((-2 < iVar24 && iVar2 < (int)uVar10) && (iVar1 < (int)uVar5 && -2 < iVar22)) {
          uVar15 = (iVar2 * src->w + iVar1) * src->elempack;
        }
        local_78[3] = uVar15;
        local_78[4] = (uint)(fVar19 - (float)iVar22);
        local_78[5] = (uint)(fVar23 - (float)iVar24);
        local_78 = local_78 + 6;
      }
      local_98 = (void *)((long)local_98 + sVar7 * sVar8);
    }
  }
  else {
    pvVar6 = grid->data;
    sVar7 = grid->elemsize;
    sVar8 = grid->cstep;
    uVar12 = 0;
    uVar18 = (ulong)uVar17;
    if ((int)uVar17 < 1) {
      uVar18 = uVar12;
    }
    uVar17 = 0xffffffff;
    for (; (int)uVar18 != (int)uVar12; uVar12 = uVar12 + 1) {
      uVar4 = src->w;
      uVar9 = src->h;
      fVar19 = (float)(uVar4 + -1) * (*(float *)((long)pvVar6 + uVar12 * 4) * 0.5 + 0.5);
      fVar23 = (float)(uVar9 + -1) *
               (*(float *)((long)pvVar6 + uVar12 * 4 + sVar7 * sVar8) * 0.5 + 0.5);
      fVar20 = floorf(fVar19);
      fVar21 = floorf(fVar23);
      iVar22 = (int)fVar20;
      iVar24 = (int)fVar21;
      iVar1 = iVar22 + 1;
      iVar2 = iVar24 + 1;
      auVar25._0_4_ = -(uint)(-1 < iVar22);
      auVar25._4_4_ = -(uint)(-1 < iVar24);
      auVar25._8_4_ = -(uint)(-1 < (int)extraout_XMM0_Db);
      auVar25._12_4_ = -(uint)(-1 < (int)extraout_XMM0_Db_00);
      auVar31._0_4_ = -(uint)(iVar22 < (int)uVar4);
      auVar31._4_4_ = -(uint)(iVar24 < (int)uVar9);
      auVar31._8_4_ = -(uint)((int)extraout_XMM0_Db < 0);
      auVar31._12_4_ = -(uint)((int)extraout_XMM0_Db_00 < 0);
      auVar31 = auVar31 & auVar25;
      auVar26._0_8_ = auVar31._0_8_;
      auVar26._8_4_ = auVar31._4_4_;
      auVar26._12_4_ = auVar31._12_4_;
      auVar27._0_8_ = auVar26._0_8_ << 0x3f;
      auVar27._8_8_ = auVar26._8_8_ << 0x3f;
      in_R10D = movmskpd(in_R10D,auVar27);
      bVar16 = (byte)in_R10D >> 1;
      in_R10D = in_R10D & 1;
      *local_78 = -(uint)((bVar16 & in_R10D) == 0) | (uVar4 * iVar24 + iVar22) * src->elempack;
      uVar14 = uVar17;
      if (((iVar1 < (int)uVar4 && -2 < iVar22) & bVar16) != 0) {
        uVar14 = (iVar24 * src->w + iVar1) * src->elempack;
      }
      local_78[1] = uVar14;
      uVar14 = uVar17;
      if (((-2 < iVar24 && iVar2 < (int)uVar9) & in_R10D) != 0) {
        uVar14 = (src->w * iVar2 + iVar22) * src->elempack;
      }
      local_78[2] = uVar14;
      uVar14 = uVar17;
      if ((-2 < iVar24 && iVar2 < (int)uVar9) && (iVar1 < (int)uVar4 && -2 < iVar22)) {
        uVar14 = (iVar2 * src->w + iVar1) * src->elempack;
      }
      local_78[3] = uVar14;
      *(ulong *)(local_78 + 4) = CONCAT44(fVar23 - (float)iVar24,fVar19 - (float)iVar22);
      local_78 = local_78 + 6;
    }
  }
  return;
}

Assistant:

void gridsample_2d_bilinear_compute_blob(const Mat& src, const Mat& grid, Mat& offset_value, int permute_fusion)
{
    const int grid_size = grid.w * grid.h;

    float* offset_value_ptr = offset_value.channel(0);

    grid_sample_unormalize<align_corner> unormalize;
    compute_coord<pd, align_corner> get_coord;

    if (permute_fusion == 0)
    {
        for (int y = 0; y < grid.c; y++)
        {
            const float* gridptr = grid.channel(y);
            int x = 0;
#if __AVX__
            for (; x + 15 < grid_size; x += 16)
            {
                __m256 gx = _mm256_loadu_ps(gridptr);
                __m256 gy = _mm256_loadu_ps(gridptr + 8);

                transpose2x8_ps(gx, gy);

                gx = unormalize(_mm256_set1_ps(src.w), gx);
                gx = get_coord(_mm256_set1_ps(src.w), gx);

                gy = unormalize(_mm256_set1_ps(src.h), gy);
                gy = get_coord(_mm256_set1_ps(src.h), gy);

                __m256 x_w = _mm256_floor_ps(gx);
                __m256 y_n = _mm256_floor_ps(gy);

                __m256 x1 = _mm256_add_ps(x_w, _mm256_set1_ps(1));
                __m256 y1 = _mm256_add_ps(y_n, _mm256_set1_ps(1));

                __m256 x0_in_range = _mm256_and_ps(_mm256_cmp_ps(x_w, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.w), x_w, _CMP_GT_OS));
                __m256 x1_in_range = _mm256_and_ps(_mm256_cmp_ps(x1, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.w), x1, _CMP_GT_OS));
                __m256 y0_in_range = _mm256_and_ps(_mm256_cmp_ps(y_n, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.h), y_n, _CMP_GT_OS));
                __m256 y1_in_range = _mm256_and_ps(_mm256_cmp_ps(y1, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.h), y1, _CMP_GT_OS));

                __m256 v00_in_range = _mm256_and_ps(x0_in_range, y0_in_range);
                __m256 v01_in_range = _mm256_and_ps(x1_in_range, y0_in_range);
                __m256 v10_in_range = _mm256_and_ps(x0_in_range, y1_in_range);
                __m256 v11_in_range = _mm256_and_ps(x1_in_range, y1_in_range);

                __m256 nw_offset = _mm256_mul_ps(_mm256_comp_fmadd_ps(y_n, _mm256_set1_ps(src.w), x_w), _mm256_set1_ps(src.elempack));
                __m256 ne_offset = _mm256_add_ps(nw_offset, _mm256_set1_ps(src.elempack));
                __m256 sw_offset = _mm256_comp_fmadd_ps(_mm256_set1_ps(src.w), _mm256_set1_ps(src.elempack), nw_offset);
                __m256 se_offset = _mm256_add_ps(sw_offset, _mm256_set1_ps(src.elempack));

                nw_offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), nw_offset, v00_in_range);
                ne_offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), ne_offset, v01_in_range);
                sw_offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), sw_offset, v10_in_range);
                se_offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), se_offset, v11_in_range);

                nw_offset = _mm256_castsi256_ps(_mm256_cvtps_epi32(nw_offset));
                ne_offset = _mm256_castsi256_ps(_mm256_cvtps_epi32(ne_offset));
                sw_offset = _mm256_castsi256_ps(_mm256_cvtps_epi32(sw_offset));
                se_offset = _mm256_castsi256_ps(_mm256_cvtps_epi32(se_offset));

                __m256 alpha = _mm256_sub_ps(gx, x_w);
                __m256 beta = _mm256_sub_ps(gy, y_n);

                transpose8x6_ps(nw_offset, ne_offset, sw_offset, se_offset, alpha, beta);

                _mm256_storeu_ps(offset_value_ptr, nw_offset);
                _mm256_storeu_ps(offset_value_ptr + 8, ne_offset);
                _mm256_storeu_ps(offset_value_ptr + 16, sw_offset);
                _mm256_storeu_ps(offset_value_ptr + 24, se_offset);

                _mm256_storeu_ps(offset_value_ptr + 32, alpha);
                _mm256_storeu_ps(offset_value_ptr + 40, beta);

                gridptr += 16;
                offset_value_ptr += 48;
            }
#endif // __AVX__

            for (; x < grid_size; x += 2)
            {
                float sample_x = *gridptr;
                float sample_y = *(gridptr + 1);

                sample_x = unormalize(src.w, sample_x);
                sample_x = get_coord(src.w, sample_x);

                sample_y = unormalize(src.h, sample_y);
                sample_y = get_coord(src.h, sample_y);

                int x0 = (int)floorf(sample_x);
                int y0 = (int)floorf(sample_y);
                int x1 = x0 + 1;
                int y1 = y0 + 1;

                bool x0_in_bound = (x0 > -1) & (x0 < src.w);
                bool x1_in_bound = (x1 > -1) & (x1 < src.w);
                bool y0_in_bound = (y0 > -1) & (y0 < src.h);
                bool y1_in_bound = (y1 > -1) & (y1 < src.h);

                bool in_bound_00 = x0_in_bound & y0_in_bound;
                bool in_bound_01 = x1_in_bound & y0_in_bound;
                bool in_bound_10 = x0_in_bound & y1_in_bound;
                bool in_bound_11 = x1_in_bound & y1_in_bound;

                int* offset_ptr = (int*)offset_value_ptr;
                float* value_ptr = offset_value_ptr + 4;

                offset_ptr[0] = in_bound_00 ? (x0 + y0 * src.w) * src.elempack : -1.0;
                offset_ptr[1] = in_bound_01 ? (x1 + y0 * src.w) * src.elempack : -1.0;
                offset_ptr[2] = in_bound_10 ? (x0 + y1 * src.w) * src.elempack : -1.0;
                offset_ptr[3] = in_bound_11 ? (x1 + y1 * src.w) * src.elempack : -1.0;

                value_ptr[0] = sample_x - x0;
                value_ptr[1] = sample_y - y0;

                gridptr += 2;
                offset_value_ptr += 6;
            }
        }
    }
    else
    {
        const float* gridptr_x = grid.channel(0);
        const float* gridptr_y = grid.channel(1);

        int x = 0;
#if __AVX__
        for (; x + 7 < grid_size; x += 8)
        {
            __m256 gx = _mm256_loadu_ps(gridptr_x);
            __m256 gy = _mm256_loadu_ps(gridptr_y);

            gx = unormalize(_mm256_set1_ps(src.w), gx);
            gx = get_coord(_mm256_set1_ps(src.w), gx);

            gy = unormalize(_mm256_set1_ps(src.h), gy);
            gy = get_coord(_mm256_set1_ps(src.h), gy);

            __m256 x_w = _mm256_floor_ps(gx);
            __m256 y_n = _mm256_floor_ps(gy);

            __m256 x1 = _mm256_add_ps(x_w, _mm256_set1_ps(1));
            __m256 y1 = _mm256_add_ps(y_n, _mm256_set1_ps(1));

            __m256 x0_in_range = _mm256_and_ps(_mm256_cmp_ps(x_w, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.w), x_w, _CMP_GT_OS));
            __m256 x1_in_range = _mm256_and_ps(_mm256_cmp_ps(x1, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.w), x1, _CMP_GT_OS));
            __m256 y0_in_range = _mm256_and_ps(_mm256_cmp_ps(y_n, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.h), y_n, _CMP_GT_OS));
            __m256 y1_in_range = _mm256_and_ps(_mm256_cmp_ps(y1, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.h), y1, _CMP_GT_OS));

            __m256 v00_in_range = _mm256_and_ps(x0_in_range, y0_in_range);
            __m256 v01_in_range = _mm256_and_ps(x1_in_range, y0_in_range);
            __m256 v10_in_range = _mm256_and_ps(x0_in_range, y1_in_range);
            __m256 v11_in_range = _mm256_and_ps(x1_in_range, y1_in_range);

            __m256 nw_offset = _mm256_mul_ps(_mm256_comp_fmadd_ps(y_n, _mm256_set1_ps(src.w), x_w), _mm256_set1_ps(src.elempack));
            __m256 ne_offset = _mm256_add_ps(nw_offset, _mm256_set1_ps(src.elempack));
            __m256 sw_offset = _mm256_comp_fmadd_ps(_mm256_set1_ps(src.w), _mm256_set1_ps(src.elempack), nw_offset);
            __m256 se_offset = _mm256_add_ps(sw_offset, _mm256_set1_ps(src.elempack));

            nw_offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), nw_offset, v00_in_range);
            ne_offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), ne_offset, v01_in_range);
            sw_offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), sw_offset, v10_in_range);
            se_offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), se_offset, v11_in_range);

            nw_offset = _mm256_castsi256_ps(_mm256_cvtps_epi32(nw_offset));
            ne_offset = _mm256_castsi256_ps(_mm256_cvtps_epi32(ne_offset));
            sw_offset = _mm256_castsi256_ps(_mm256_cvtps_epi32(sw_offset));
            se_offset = _mm256_castsi256_ps(_mm256_cvtps_epi32(se_offset));

            __m256 alpha = _mm256_sub_ps(gx, x_w);
            __m256 beta = _mm256_sub_ps(gy, y_n);

            transpose8x6_ps(nw_offset, ne_offset, sw_offset, se_offset, alpha, beta);

            _mm256_storeu_ps(offset_value_ptr, nw_offset);
            _mm256_storeu_ps(offset_value_ptr + 8, ne_offset);
            _mm256_storeu_ps(offset_value_ptr + 16, sw_offset);
            _mm256_storeu_ps(offset_value_ptr + 24, se_offset);

            _mm256_storeu_ps(offset_value_ptr + 32, alpha);
            _mm256_storeu_ps(offset_value_ptr + 40, beta);

            gridptr_x += 8;
            gridptr_y += 8;
            offset_value_ptr += 48;
        }

#endif // __AVX__

        for (; x < grid_size; x++)
        {
            float sample_x = *gridptr_x;
            float sample_y = *gridptr_y;

            sample_x = unormalize(src.w, sample_x);
            sample_x = get_coord(src.w, sample_x);

            sample_y = unormalize(src.h, sample_y);
            sample_y = get_coord(src.h, sample_y);

            int x0 = (int)floorf(sample_x);
            int y0 = (int)floorf(sample_y);
            int x1 = x0 + 1;
            int y1 = y0 + 1;

            bool x0_in_bound = (x0 > -1) & (x0 < src.w);
            bool x1_in_bound = (x1 > -1) & (x1 < src.w);
            bool y0_in_bound = (y0 > -1) & (y0 < src.h);
            bool y1_in_bound = (y1 > -1) & (y1 < src.h);

            bool in_bound_00 = x0_in_bound & y0_in_bound;
            bool in_bound_01 = x1_in_bound & y0_in_bound;
            bool in_bound_10 = x0_in_bound & y1_in_bound;
            bool in_bound_11 = x1_in_bound & y1_in_bound;

            int* offset_ptr = (int*)offset_value_ptr;
            float* value_ptr = offset_value_ptr + 4;

            offset_ptr[0] = in_bound_00 ? (x0 + y0 * src.w) * src.elempack : -1.0;
            offset_ptr[1] = in_bound_01 ? (x1 + y0 * src.w) * src.elempack : -1.0;
            offset_ptr[2] = in_bound_10 ? (x0 + y1 * src.w) * src.elempack : -1.0;
            offset_ptr[3] = in_bound_11 ? (x1 + y1 * src.w) * src.elempack : -1.0;

            value_ptr[0] = sample_x - x0;
            value_ptr[1] = sample_y - y0;

            gridptr_x++;
            gridptr_y++;
            offset_value_ptr += 6;
        }
    }
}